

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

BasicBlock * __thiscall
FlowGraph::AddBlock(FlowGraph *this,Instr *firstInstr,Instr *lastInstr,BasicBlock *nextBlock,
                   BasicBlock *prevBlock)

{
  Kind KVar1;
  uint uVar2;
  long *plVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  LabelInstr *pLVar7;
  BasicBlock *pBVar8;
  BranchInstr *pBVar9;
  MultiBranchInstr *pMVar10;
  BasicBlock *blockSucc;
  Instr *pIVar11;
  undefined4 *puVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  void **value;
  undefined1 local_c0 [32];
  BVSparse<Memory::JitArenaAllocator> *local_a0;
  undefined1 local_98 [40];
  undefined1 local_70 [8];
  BasicBlock *blockMultiBrTarget;
  BVSparse<Memory::JitArenaAllocator> *local_60;
  Instr *local_58;
  LabelInstr *local_50;
  BasicBlock *local_48;
  BasicBlock *block;
  BasicBlock *local_38;
  
  local_58 = lastInstr;
  if ((firstInstr->m_kind == InstrKindProfiledLabel) || (firstInstr->m_kind == InstrKindLabel)) {
    local_50 = (LabelInstr *)firstInstr;
    pLVar7 = IR::Instr::AsLabelInstr(firstInstr);
  }
  else {
    pLVar7 = IR::LabelInstr::New(Label,firstInstr->m_func,false);
    IR::Instr::SetByteCodeOffset(&pLVar7->super_Instr,firstInstr);
    local_50 = pLVar7;
    if (firstInstr->m_kind == InstrKindEntry) {
      IR::Instr::InsertAfter(firstInstr,&pLVar7->super_Instr);
    }
    else {
      IR::Instr::InsertBefore(firstInstr,&pLVar7->super_Instr);
    }
  }
  pBVar8 = pLVar7->m_block;
  local_48 = pBVar8;
  if (pBVar8 == (BasicBlock *)0x0) {
    pBVar8 = BasicBlock::New(this);
    local_48 = pBVar8;
    IR::LabelInstr::SetBasicBlock(pLVar7,pBVar8);
    if (this->tailBlock == (BasicBlock *)0x0) {
      this->tailBlock = pBVar8;
    }
  }
  bVar5 = IR::Instr::EndsBasicBlock(local_58);
  if (bVar5) {
    if (local_58->m_kind == InstrKindBranch) {
      block = nextBlock;
      local_38 = prevBlock;
      pBVar9 = IR::Instr::AsBranchInstr(local_58);
      bVar5 = IR::BranchInstr::IsMultiBranch(pBVar9);
      if (bVar5) {
        pMVar10 = IR::BranchInstr::AsMultiBrInstr(pBVar9);
        prevBlock = local_38;
        nextBlock = block;
        local_c0._0_8_ = local_70;
        local_60 = (BVSparse<Memory::JitArenaAllocator> *)local_c0;
        local_c0._16_8_ = &local_48;
        local_98._16_8_ = ((pMVar10->super_BranchInstr).super_Instr.m_func)->m_alloc;
        local_98._24_8_ = local_98;
        local_98._0_8_ = (BasicBlock *)0x0;
        local_98._8_8_ = (BasicBlock *)0x0;
        plVar3 = (long *)pMVar10->m_branchTargets;
        local_c0._8_8_ = this;
        blockMultiBrTarget = (BasicBlock *)local_98._24_8_;
        if (plVar3 != (long *)0x0) {
          KVar1 = pMVar10->m_kind;
          if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
            lVar13 = pMVar10->m_baseCaseValue;
            lVar15 = lVar13 * 8 + *plVar3;
            for (; lVar13 <= pMVar10->m_lastCaseValue; lVar13 = lVar13 + 1) {
              anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
              anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                        ((anon_class_16_1_3fcf6586_for_fn *)&blockMultiBrTarget,
                         (void **)(lVar15 + pMVar10->m_baseCaseValue * -8));
              lVar15 = lVar15 + 8;
            }
            value = (void **)(plVar3 + 1);
            nextBlock = block;
            prevBlock = local_38;
          }
          else if (KVar1 == StrDictionary) {
            local_c0._24_8_ = local_98._24_8_;
            local_a0 = local_60;
            for (uVar16 = 0; uVar16 < *(uint *)((long)plVar3 + 0x1c); uVar16 = uVar16 + 1) {
              iVar14 = *(int *)(*plVar3 + uVar16 * 4);
              if (iVar14 != -1) {
                while (iVar14 != -1) {
                  lVar13 = (long)iVar14;
                  iVar14 = *(int *)(plVar3[1] + 8 + lVar13 * 0x18);
                  anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
                  anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                            ((anon_class_16_1_3fcf6586_for_fn *)(local_c0 + 0x18),
                             (void **)(plVar3[1] + lVar13 * 0x18));
                }
              }
            }
            value = (void **)(plVar3 + 7);
            nextBlock = block;
            prevBlock = local_38;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x435,"(false)","false");
            if (!bVar5) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar12 = 0;
            value = (void **)0x0;
          }
          anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
          anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                    ((anon_class_16_1_3fcf6586_for_fn *)&blockMultiBrTarget,value);
        }
        BVSparse<Memory::JitArenaAllocator>::~BVSparse
                  ((BVSparse<Memory::JitArenaAllocator> *)local_98);
        goto LAB_003f7237;
      }
      blockSucc = SetBlockTargetAndLoopFlag(this,pBVar9->m_branchTarget);
      bVar5 = IR::BranchInstr::IsConditional(pBVar9);
      nextBlock = block;
      prevBlock = local_38;
      if (bVar5) {
        pIVar11 = IR::Instr::GetNextRealInstrOrLabel(&pBVar9->super_Instr);
        if ((pIVar11->m_kind == InstrKindProfiledLabel) ||
           (nextBlock = block, prevBlock = local_38, pIVar11->m_kind == InstrKindLabel)) {
          pLVar7 = IR::Instr::AsLabelInstr(pIVar11);
          SetBlockTargetAndLoopFlag(this,pLVar7);
          nextBlock = block;
          prevBlock = local_38;
        }
      }
    }
    else if ((local_58->m_opcode != Ret) || (blockSucc = this->tailBlock, pBVar8 == blockSucc))
    goto LAB_003f7237;
    if (blockSucc != (BasicBlock *)0x0) {
      AddEdge(this,pBVar8,blockSucc);
    }
  }
LAB_003f7237:
  pIVar11 = local_58;
  bVar5 = IR::Instr::HasFallThrough(local_58);
  if (bVar5) {
    BVar6 = Func::HasTry(this->func);
    if ((BVar6 == 0) && (pIVar11->m_kind != InstrKindBranch)) {
      pLVar7 = IR::Instr::AsLabelInstr(pIVar11->m_next);
      pBVar9 = IR::BranchInstr::New(Br,pLVar7,pIVar11->m_func);
      IR::Instr::SetByteCodeOffset(&pBVar9->super_Instr,pIVar11->m_next);
      IR::Instr::InsertAfter(pIVar11,&pBVar9->super_Instr);
    }
    AddEdge(this,local_48,nextBlock);
  }
  uVar2 = this->blockCount;
  this->blockCount = uVar2 + 1;
  local_48->number = uVar2;
  local_48->firstInstr = &local_50->super_Instr;
  if (prevBlock == (BasicBlock *)0x0) {
    pBVar8 = this->blockList;
    if (pBVar8 != (BasicBlock *)0x0) {
      pBVar8->prev = local_48;
    }
    local_48->next = pBVar8;
    this->blockList = local_48;
  }
  else {
    prevBlock->next = local_48;
    local_48->prev = prevBlock;
    local_48->next = nextBlock;
    nextBlock->prev = local_48;
  }
  return local_48;
}

Assistant:

BasicBlock *
FlowGraph::AddBlock(
    IR::Instr * firstInstr,
    IR::Instr * lastInstr,
    BasicBlock * nextBlock,
    BasicBlock *prevBlock)
{
    BasicBlock * block;
    IR::LabelInstr * labelInstr;

    if (firstInstr->IsLabelInstr())
    {
        labelInstr = firstInstr->AsLabelInstr();
    }
    else
    {
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, firstInstr->m_func);
        labelInstr->SetByteCodeOffset(firstInstr);
        if (firstInstr->IsEntryInstr())
        {
            firstInstr->InsertAfter(labelInstr);
        }
        else
        {
            firstInstr->InsertBefore(labelInstr);
        }
        firstInstr = labelInstr;
    }

    block = labelInstr->GetBasicBlock();
    if (block == nullptr)
    {
        block = BasicBlock::New(this);
        labelInstr->SetBasicBlock(block);
        // Remember last block in function to target successor of RETs.
        if (!this->tailBlock)
        {
            this->tailBlock = block;
        }
    }

    // Hook up the successor edges
    if (lastInstr->EndsBasicBlock())
    {
        BasicBlock * blockTarget = nullptr;

        if (lastInstr->IsBranchInstr())
        {
            // Hook up a successor edge to the branch target.
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();

            if(branchInstr->IsMultiBranch())
            {
                BasicBlock * blockMultiBrTarget;

                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                multiBranchInstr->MapUniqueMultiBrLabels([&](IR::LabelInstr * labelInstr) -> void
                {
                    blockMultiBrTarget = SetBlockTargetAndLoopFlag(labelInstr);
                    this->AddEdge(block, blockMultiBrTarget);
                });
            }
            else
            {
                IR::LabelInstr * targetLabelInstr = branchInstr->GetTarget();
                blockTarget = SetBlockTargetAndLoopFlag(targetLabelInstr);
                if (branchInstr->IsConditional())
                {
                    IR::Instr *instrNext = branchInstr->GetNextRealInstrOrLabel();

                    if (instrNext->IsLabelInstr())
                    {
                        SetBlockTargetAndLoopFlag(instrNext->AsLabelInstr());
                    }
                }
            }
        }
        else if (lastInstr->m_opcode == Js::OpCode::Ret && block != this->tailBlock)
        {
            blockTarget = this->tailBlock;
        }

        if (blockTarget)
        {
            this->AddEdge(block, blockTarget);
        }
    }

    if (lastInstr->HasFallThrough())
    {
        // Add a branch to next instruction so that we don't have to update the flow graph
        // when the glob opt tries to insert instructions.
        // We don't run the globopt with try/catch, don't need to insert branch to next for fall through blocks.
        if (!this->func->HasTry() && !lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * instr = IR::BranchInstr::New(Js::OpCode::Br,
                lastInstr->m_next->AsLabelInstr(), lastInstr->m_func);
            instr->SetByteCodeOffset(lastInstr->m_next);
            lastInstr->InsertAfter(instr);
            lastInstr = instr;
        }
        this->AddEdge(block, nextBlock);
    }

    block->SetBlockNum(this->blockCount++);
    block->SetFirstInstr(firstInstr);
    block->SetLastInstr(lastInstr);

    if (!prevBlock)
    {
        if (this->blockList)
        {
            this->blockList->prev = block;
        }
        block->next = this->blockList;
        this->blockList = block;
    }
    else
    {
        prevBlock->next = block;
        block->prev = prevBlock;
        block->next = nextBlock;
        nextBlock->prev = block;
    }
    return block;
}